

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::get_eq_marks
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  Alloc *pAVar6;
  uint size_in;
  size_t __n;
  ulong uVar7;
  void *__buf;
  void *extraout_RDX;
  size_t i;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Read<signed_char> RVar12;
  Write<signed_char> eq_marks_w;
  Read<int> d_sorted_class_ids;
  HostWrite<int> h_sorted_class_ids;
  vector<int,_std::allocator<int>_> sorted_class_ids;
  Read<int> eq_class_ids;
  Read<signed_char> eq_class_dims;
  type f;
  string local_1b0;
  Int local_190;
  Write<int> local_188;
  Write<int> local_178;
  uint local_168;
  Write<signed_char> local_160;
  Write<int> local_150;
  Write<int> local_140;
  _Vector_base<int,_std::allocator<int>_> local_130;
  Alloc *local_118;
  Write<signed_char> local_110;
  undefined1 local_100 [32];
  Write<int> local_e0;
  Write<signed_char> local_d0;
  Write<signed_char> local_c0;
  Int local_b0;
  Write<int> local_a8;
  Write<int> local_98;
  uint local_88;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Int local_60;
  Write<int> local_58;
  Write<int> local_48;
  uint local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_130,class_ids);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_130._M_impl.super__Vector_impl_data._M_start,
             local_130._M_impl.super__Vector_impl_data._M_finish);
  piVar5 = local_130._M_impl.super__Vector_impl_data._M_finish;
  piVar4 = local_130._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_1b0,"",(allocator *)&local_d0);
  HostWrite<int>::HostWrite
            ((HostWrite<int> *)&local_140,(LO)((ulong)((long)piVar5 - (long)piVar4) >> 2),&local_1b0
            );
  std::__cxx11::string::~string((string *)&local_1b0);
  __n = (long)local_130._M_impl.super__Vector_impl_data._M_finish -
        (long)local_130._M_impl.super__Vector_impl_data._M_start >> 2;
  __buf = (void *)0x0;
  for (sVar8 = 0; __n != sVar8; sVar8 = sVar8 + 1) {
    *(int *)((long)local_140.shared_alloc_.direct_ptr + ((long)__buf >> 0x1e)) =
         local_130._M_impl.super__Vector_impl_data._M_start[sVar8];
    __buf = (void *)((long)__buf + 0x100000000);
  }
  HostWrite<int>::write((HostWrite<int> *)&local_e0,(int)&local_140,__buf,__n);
  Read<int>::Read((Read<signed_char> *)&local_150,&local_e0);
  Write<int>::~Write(&local_e0);
  if (((ulong)local_150.shared_alloc_.alloc & 1) == 0) {
    uVar7 = (local_150.shared_alloc_.alloc)->size;
  }
  else {
    uVar7 = (ulong)local_150.shared_alloc_.alloc >> 3;
  }
  std::__cxx11::string::string((string *)&local_1b0,"class_dim",(allocator *)&local_d0);
  Mesh::get_array<signed_char>
            ((Mesh *)(local_100 + 0x10),(Int)mesh,(string *)(ulong)(uint)class_dim);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1b0,"class_id",(allocator *)&local_d0);
  Mesh::get_array<int>((Mesh *)local_100,(Int)mesh,(string *)(ulong)(uint)class_dim);
  std::__cxx11::string::~string((string *)&local_1b0);
  size_in = Mesh::nents(mesh,class_dim);
  std::__cxx11::string::string((string *)&local_1b0,"",(allocator *)&local_d0);
  Write<signed_char>::Write(&local_160,size_in,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  Write<signed_char>::Write(&local_80,&local_160);
  local_118 = (Alloc *)this;
  Write<signed_char>::Write(&local_70,(Write<signed_char> *)(local_100 + 0x10));
  local_60 = class_dim;
  Write<int>::Write(&local_58,&local_150);
  Write<int>::Write(&local_48,(Write<int> *)local_100);
  local_38 = (uint)(uVar7 >> 2);
  Write<signed_char>::Write(&local_d0,&local_80);
  Write<signed_char>::Write(&local_c0,&local_70);
  local_b0 = local_60;
  Write<int>::Write(&local_a8,&local_58);
  Write<int>::Write(&local_98,&local_48);
  local_88 = local_38;
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_1b0,&local_d0);
    Write<signed_char>::Write((Write<signed_char> *)&local_1b0.field_2,&local_c0);
    local_190 = local_b0;
    Write<int>::Write(&local_188,&local_a8);
    Write<int>::Write(&local_178,&local_98);
    local_168 = local_88;
    entering_parallel = 0;
    for (uVar7 = 0; uVar7 != size_in; uVar7 = uVar7 + 1) {
      uVar10 = 0;
      if ((char)local_190 == *(char *)(local_1b0.field_2._8_8_ + uVar7)) {
        iVar1 = *(int *)((long)local_178.shared_alloc_.direct_ptr + uVar7 * 4);
        uVar11 = (ulong)local_88;
        do {
          iVar3 = (int)uVar11;
          while( true ) {
            if (iVar3 <= (int)uVar10) goto LAB_002c01db;
            uVar9 = uVar10 + iVar3 + -1 >> 1;
            uVar11 = (ulong)uVar9;
            iVar2 = *(int *)((long)local_188.shared_alloc_.direct_ptr + uVar11 * 4);
            if (iVar1 <= iVar2) break;
            uVar10 = uVar9 + 1;
          }
        } while (iVar1 < iVar2);
LAB_002c01db:
        uVar10 = (uint)((int)uVar10 < iVar3);
      }
      *(char *)(local_1b0._M_string_length + uVar7) = (char)uVar10;
    }
    get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
              ((__0 *)&local_1b0);
  }
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)&local_d0);
  Write<signed_char>::Write(&local_110,&local_160);
  pAVar6 = local_118;
  Read<signed_char>::Read((Read<signed_char> *)local_118,&local_110);
  Write<signed_char>::~Write(&local_110);
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)&local_80);
  Write<signed_char>::~Write(&local_160);
  Write<int>::~Write((Write<int> *)local_100);
  Write<signed_char>::~Write((Write<signed_char> *)(local_100 + 0x10));
  Write<int>::~Write(&local_150);
  Write<int>::~Write(&local_140);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_130);
  RVar12.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar12.write_.shared_alloc_.alloc = pAVar6;
  return (Read<signed_char>)RVar12.write_.shared_alloc_;
}

Assistant:

Read<I8> get_eq_marks(
    Mesh* mesh, Int class_dim, std::vector<ClassId> const& class_ids) {
  auto sorted_class_ids = class_ids;
  std::sort(begin(sorted_class_ids), end(sorted_class_ids));
  HostWrite<LO> h_sorted_class_ids(LO(sorted_class_ids.size()));
  for (size_t i = 0; i < sorted_class_ids.size(); ++i) {
    h_sorted_class_ids[LO(i)] = sorted_class_ids[i];
  }
  auto d_sorted_class_ids = Read<ClassId>(h_sorted_class_ids.write());
  auto nclass_ids = d_sorted_class_ids.size();
  auto eq_class_dims = mesh->get_array<I8>(class_dim, "class_dim");
  auto eq_class_ids = mesh->get_array<LO>(class_dim, "class_id");
  auto neq = mesh->nents(class_dim);
  Write<I8> eq_marks_w(neq);
  auto f = OMEGA_H_LAMBDA(LO eq) {
    eq_marks_w[eq] = I8((eq_class_dims[eq] == I8(class_dim)) &&
                        (-1 != binary_search(d_sorted_class_ids,
                                   eq_class_ids[eq], nclass_ids)));
  };
  parallel_for(neq, f, "mark_class_closures");
  return eq_marks_w;
}